

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

bool __thiscall
deqp::UniformBlockCase::compareStd140Blocks
          (UniformBlockCase *this,UniformLayout *refLayout,UniformLayout *cmpLayout)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  TestLog *this_00;
  UniformBlock *this_01;
  char *pcVar4;
  MessageBuilder *pMVar5;
  size_type sVar6;
  size_type sVar7;
  reference piVar8;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  MessageBuilder local_6f8;
  const_reference local_578;
  UniformLayoutEntry *cmpEntry;
  int local_3ec;
  const_reference pvStack_3e8;
  int cmpEntryNdx;
  UniformLayoutEntry *refEntry;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_3d8;
  const_iterator ndxIter;
  size_type local_3c8;
  MessageBuilder local_3c0;
  const_reference local_240;
  BlockLayoutEntry *cmpBlockLayout;
  BlockLayoutEntry *refBlockLayout;
  undefined4 local_ac;
  byte local_a5;
  int local_a4;
  int iStack_a0;
  bool isUsed;
  int cmpBlockNdx;
  int refBlockNdx;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string instanceName;
  bool isArray;
  UniformBlock *block;
  int blockNdx;
  int numBlocks;
  bool isOk;
  TestLog *log;
  UniformLayout *cmpLayout_local;
  UniformLayout *refLayout_local;
  UniformBlockCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  blockNdx._3_1_ = true;
  iVar2 = ub::ShaderInterface::getNumUniformBlocks(&this->m_interface);
  for (block._4_4_ = 0; block._4_4_ < iVar2; block._4_4_ = block._4_4_ + 1) {
    this_01 = ub::ShaderInterface::getUniformBlock(&this->m_interface,block._4_4_);
    instanceName.field_2._M_local_buf[0xf] = ub::UniformBlock::isArray(this_01);
    pcVar4 = ub::UniformBlock::getBlockName(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar4,&local_89);
    pcVar4 = "";
    if ((instanceName.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar4 = "[0]";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_88,pcVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iStack_a0 = ub::UniformLayout::getBlockIndex(refLayout,pcVar4);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_a4 = ub::UniformLayout::getBlockIndex(cmpLayout,pcVar4);
    dVar3 = ub::UniformBlock::getFlags(this_01);
    local_a5 = (dVar3 & 0x300) != 0;
    dVar3 = ub::UniformBlock::getFlags(this_01);
    if ((dVar3 & 0x20) == 0) {
      local_ac = 4;
    }
    else if (local_a4 < 0) {
      if ((local_a5 & 1) != 0) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&refBlockLayout,this_00,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&refBlockLayout,
                            (char (*) [23])"Error: Uniform block \'");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"\' not found");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&refBlockLayout);
        blockNdx._3_1_ = false;
      }
      local_ac = 4;
    }
    else {
      cmpBlockLayout =
           std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
           operator[](&refLayout->blocks,(long)iStack_a0);
      local_240 = std::
                  vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                  operator[](&cmpLayout->blocks,(long)local_a4);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&cmpBlockLayout->activeUniformIndices);
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&local_240->activeUniformIndices);
      if (sVar6 != sVar7) {
        tcu::TestLog::operator<<(&local_3c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_3c0,
                            (char (*) [51])"Error: Number of active uniforms differ in block \'");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])"\' (expected ");
        local_3c8 = std::vector<int,_std::allocator<int>_>::size
                              (&cmpBlockLayout->activeUniformIndices);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3c8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2c59494);
        ndxIter._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::size(&local_240->activeUniformIndices);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(unsigned_long *)&ndxIter);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a85ff4);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3c0);
        blockNdx._3_1_ = false;
      }
      local_3d8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            (&cmpBlockLayout->activeUniformIndices);
      while( true ) {
        refEntry = (UniformLayoutEntry *)
                   std::vector<int,_std::allocator<int>_>::end
                             (&cmpBlockLayout->activeUniformIndices);
        bVar1 = __gnu_cxx::operator!=
                          (&local_3d8,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)&refEntry);
        if (!bVar1) break;
        piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_3d8);
        pvStack_3e8 = std::
                      vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                      ::operator[](&refLayout->uniforms,(long)*piVar8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        local_3ec = ub::UniformLayout::getUniformIndex(cmpLayout,pcVar4);
        if (local_3ec < 0) {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&cmpEntry,this_00,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar5 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&cmpEntry,(char (*) [17])"Error: Uniform \'");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvStack_3e8->name);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"\' not found");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&cmpEntry);
          blockNdx._3_1_ = false;
        }
        else {
          local_578 = std::
                      vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                      ::operator[](&cmpLayout->uniforms,(long)local_3ec);
          if ((((pvStack_3e8->type != local_578->type) || (pvStack_3e8->size != local_578->size)) ||
              (pvStack_3e8->offset != local_578->offset)) ||
             (((pvStack_3e8->arrayStride != local_578->arrayStride ||
               (pvStack_3e8->matrixStride != local_578->matrixStride)) ||
              ((pvStack_3e8->isRowMajor & 1U) != (local_578->isRowMajor & 1U))))) {
            tcu::TestLog::operator<<(&local_6f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_6f8,(char (*) [28])"Error: Layout mismatch in \'");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvStack_3e8->name);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\':\n");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])"  expected: type = ");
            local_700 = glu::getDataTypeName(pvStack_3e8->type);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_700);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])0x2c74f6a);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvStack_3e8->size);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2c387cb);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvStack_3e8->offset);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])", array stride = ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvStack_3e8->arrayStride);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])", matrix stride = ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvStack_3e8->matrixStride);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])", row major = ");
            local_708 = "false";
            if ((pvStack_3e8->isRowMajor & 1U) != 0) {
              local_708 = "true";
            }
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_708);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])"  got: type = ");
            local_710 = glu::getDataTypeName(local_578->type);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_710);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])0x2c74f6a);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_578->size);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2c387cb);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_578->offset);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])", array stride = ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_578->arrayStride);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])", matrix stride = ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_578->matrixStride);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])", row major = ");
            local_718 = "false";
            if ((local_578->isRowMajor & 1U) != 0) {
              local_718 = "true";
            }
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_718);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_6f8);
            blockNdx._3_1_ = false;
          }
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_3d8,0);
      }
      local_ac = 0;
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  return blockNdx._3_1_;
}

Assistant:

bool UniformBlockCase::compareStd140Blocks(const UniformLayout& refLayout, const UniformLayout& cmpLayout) const
{
	TestLog& log	   = m_testCtx.getLog();
	bool	 isOk	  = true;
	int		 numBlocks = m_interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const UniformBlock& block		 = m_interface.getUniformBlock(blockNdx);
		bool				isArray		 = block.isArray();
		std::string			instanceName = string(block.getBlockName()) + (isArray ? "[0]" : "");
		int					refBlockNdx  = refLayout.getBlockIndex(instanceName.c_str());
		int					cmpBlockNdx  = cmpLayout.getBlockIndex(instanceName.c_str());
		bool				isUsed		 = (block.getFlags() & (DECLARE_VERTEX | DECLARE_FRAGMENT)) != 0;

		if ((block.getFlags() & LAYOUT_STD140) == 0)
			continue; // Not std140 layout.

		DE_ASSERT(refBlockNdx >= 0);

		if (cmpBlockNdx < 0)
		{
			// Not found, should it?
			if (isUsed)
			{
				log << TestLog::Message << "Error: Uniform block '" << instanceName << "' not found"
					<< TestLog::EndMessage;
				isOk = false;
			}

			continue; // Skip block.
		}

		const BlockLayoutEntry& refBlockLayout = refLayout.blocks[refBlockNdx];
		const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

		// \todo [2012-01-24 pyry] Verify that activeUniformIndices is correct.
		// \todo [2012-01-24 pyry] Verify all instances.
		if (refBlockLayout.activeUniformIndices.size() != cmpBlockLayout.activeUniformIndices.size())
		{
			log << TestLog::Message << "Error: Number of active uniforms differ in block '" << instanceName
				<< "' (expected " << refBlockLayout.activeUniformIndices.size() << ", got "
				<< cmpBlockLayout.activeUniformIndices.size() << ")" << TestLog::EndMessage;
			isOk = false;
		}

		for (vector<int>::const_iterator ndxIter = refBlockLayout.activeUniformIndices.begin();
			 ndxIter != refBlockLayout.activeUniformIndices.end(); ndxIter++)
		{
			const UniformLayoutEntry& refEntry	= refLayout.uniforms[*ndxIter];
			int						  cmpEntryNdx = cmpLayout.getUniformIndex(refEntry.name.c_str());

			if (cmpEntryNdx < 0)
			{
				log << TestLog::Message << "Error: Uniform '" << refEntry.name << "' not found" << TestLog::EndMessage;
				isOk = false;
				continue;
			}

			const UniformLayoutEntry& cmpEntry = cmpLayout.uniforms[cmpEntryNdx];

			if (refEntry.type != cmpEntry.type || refEntry.size != cmpEntry.size ||
				refEntry.offset != cmpEntry.offset || refEntry.arrayStride != cmpEntry.arrayStride ||
				refEntry.matrixStride != cmpEntry.matrixStride || refEntry.isRowMajor != cmpEntry.isRowMajor)
			{
				log << TestLog::Message << "Error: Layout mismatch in '" << refEntry.name << "':\n"
					<< "  expected: type = " << glu::getDataTypeName(refEntry.type) << ", size = " << refEntry.size
					<< ", offset = " << refEntry.offset << ", array stride = " << refEntry.arrayStride
					<< ", matrix stride = " << refEntry.matrixStride
					<< ", row major = " << (refEntry.isRowMajor ? "true" : "false") << "\n"
					<< "  got: type = " << glu::getDataTypeName(cmpEntry.type) << ", size = " << cmpEntry.size
					<< ", offset = " << cmpEntry.offset << ", array stride = " << cmpEntry.arrayStride
					<< ", matrix stride = " << cmpEntry.matrixStride
					<< ", row major = " << (cmpEntry.isRowMajor ? "true" : "false") << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}